

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void __thiscall
tcu::CompressedTexture::CompressedTexture
          (CompressedTexture *this,CompressedTexFormat format,int width,int height,int depth)

{
  int depth_local;
  int height_local;
  int width_local;
  CompressedTexFormat format_local;
  CompressedTexture *this_local;
  
  this->m_format = COMPRESSEDTEXFORMAT_LAST;
  this->m_width = 0;
  this->m_height = 0;
  this->m_depth = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_data);
  setStorage(this,format,width,height,depth);
  return;
}

Assistant:

CompressedTexture::CompressedTexture (CompressedTexFormat format, int width, int height, int depth)
	: m_format	(COMPRESSEDTEXFORMAT_LAST)
	, m_width	(0)
	, m_height	(0)
	, m_depth	(0)
{
	setStorage(format, width, height, depth);
}